

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * QByteArray::number(qulonglong n,int base)

{
  QByteArray *in_RDI;
  qulonglong unaff_retaddr;
  QByteArray *in_stack_00000008;
  QByteArray *s;
  QByteArray *pQVar1;
  
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  pQVar1 = in_RDI;
  QByteArray((QByteArray *)0x146e2c);
  setNum(in_stack_00000008,unaff_retaddr,(int)((ulong)pQVar1 >> 0x20));
  return in_RDI;
}

Assistant:

QByteArray QByteArray::number(qulonglong n, int base)
{
    QByteArray s;
    s.setNum(n, base);
    return s;
}